

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O3

void anon_unknown.dwarf_16599::_scale
               (uint32_t *Target,int TgtWidth,int TgtHeight,uint32_t *Source,int SrcWidth,
               int SrcHeight)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint32_t *puVar7;
  uint32_t *puVar8;
  uint32_t *puVar9;
  int iVar10;
  
  if (0 < TgtHeight) {
    lVar3 = (long)TgtWidth;
    puVar7 = (uint32_t *)0x0;
    iVar5 = 0;
    iVar4 = TgtHeight;
    do {
      if (Source == puVar7) {
        memcpy(Target,Target + -lVar3,lVar3 * 4);
      }
      else {
        puVar7 = Source;
        if (0 < TgtWidth) {
          iVar2 = 0;
          puVar8 = Target;
          puVar9 = Source;
          uVar6 = TgtWidth + 1;
          do {
            *puVar8 = *puVar9;
            puVar8 = puVar8 + 1;
            iVar2 = iVar2 + SrcWidth % TgtWidth;
            iVar10 = TgtWidth;
            if (iVar2 < TgtWidth) {
              iVar10 = 0;
            }
            puVar9 = puVar9 + (long)(SrcWidth / TgtWidth) + (ulong)(TgtWidth <= iVar2);
            iVar2 = iVar2 - iVar10;
            uVar6 = uVar6 - 1;
          } while (1 < uVar6);
        }
      }
      iVar5 = iVar5 + SrcHeight % TgtHeight;
      iVar2 = SrcWidth;
      if (iVar5 < TgtHeight) {
        iVar2 = 0;
      }
      Source = Source + (long)((SrcHeight / TgtHeight) * SrcWidth) + (long)iVar2;
      iVar2 = TgtHeight;
      if (iVar5 < TgtHeight) {
        iVar2 = 0;
      }
      Target = Target + lVar3;
      iVar5 = iVar5 - iVar2;
      bVar1 = 1 < iVar4;
      iVar4 = iVar4 + -1;
    } while (bVar1);
  }
  return;
}

Assistant:

void _scale(uint32_t* Target, int TgtWidth, int TgtHeight, const uint32_t* Source, int SrcWidth, int SrcHeight)
    {    
    // image scaling with Bresenham, Thiadmer Riemersma, Dr.Dobb's.    
    int NumPixels = TgtHeight;
    int IntPart = (SrcHeight / TgtHeight) * SrcWidth;
    int FractPart = SrcHeight % TgtHeight;
    int E = 0;
    const uint32_t* PrevSource = nullptr;
    while (NumPixels-- > 0)
      {
      
      if (Source == PrevSource)
        {
        memcpy(Target, Target-TgtWidth, TgtWidth*sizeof(uint32_t));
        }
      else
        {
        _scale_line(Target, Source, SrcWidth, TgtWidth);
        PrevSource = Source;
        }
      
      Target += TgtWidth;
      Source += IntPart;
      E += FractPart;
      if (E >= TgtHeight)
        {
        E -= TgtHeight;
        Source += SrcWidth;
        }        
      }
    }